

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  uint32_t *puVar1;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  uint32_t uVar5;
  secp256k1_fe *rzr_00;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  secp256k1_fe i;
  secp256k1_fe s1;
  secp256k1_fe z12;
  secp256k1_fe z22;
  secp256k1_fe i2;
  secp256k1_fe h;
  secp256k1_fe s2;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe local_220;
  secp256k1_fe *local_1f8;
  secp256k1_fe *local_1f0;
  secp256k1_fe local_1e8;
  secp256k1_fe local_1c0;
  secp256k1_fe local_198;
  secp256k1_fe local_170;
  secp256k1_fe local_148;
  secp256k1_fe local_120;
  secp256k1_fe local_f8;
  secp256k1_fe local_d0;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      r->infinity = 0;
      a_00 = &b->z;
      secp256k1_fe_sqr(&local_198,a_00);
      a_01 = &a->z;
      secp256k1_fe_sqr(&local_1c0,a_01);
      secp256k1_fe_mul(&local_d0,&a->x,&local_198);
      secp256k1_fe_mul(&local_f8,&b->x,&local_1c0);
      secp256k1_fe_mul(&local_1e8,&a->y,&local_198);
      local_1f0 = a_00;
      secp256k1_fe_mul(&local_1e8,&local_1e8,a_00);
      secp256k1_fe_mul(&local_120,&b->y,&local_1c0);
      local_1f8 = a_01;
      secp256k1_fe_mul(&local_120,&local_120,a_01);
      local_148.n[0] = (0xffff0bc - local_d0.n[0]) + local_f8.n[0];
      local_148.n[1] = (0xffffefc - local_d0.n[1]) + local_f8.n[1];
      local_148.n[2] = (0xffffffc - local_d0.n[2]) + local_f8.n[2];
      local_148.n[3] = (0xffffffc - local_d0.n[3]) + local_f8.n[3];
      local_148.n[4] = (0xffffffc - local_d0.n[4]) + local_f8.n[4];
      local_148.n[5] = (0xffffffc - local_d0.n[5]) + local_f8.n[5];
      local_148.n[6] = (0xffffffc - local_d0.n[6]) + local_f8.n[6];
      local_148.n[7] = (0xffffffc - local_d0.n[7]) + local_f8.n[7];
      local_148.n[8] = (0xffffffc - local_d0.n[8]) + local_f8.n[8];
      local_148.n[9] = (0xfffffc - local_d0.n[9]) + local_f8.n[9];
      local_220.n[0] = (0xffff0bc - local_1e8.n[0]) + local_120.n[0];
      local_220.n[1] = (0xffffefc - local_1e8.n[1]) + local_120.n[1];
      local_220.n[2] = (0xffffffc - local_1e8.n[2]) + local_120.n[2];
      local_220.n[3] = (0xffffffc - local_1e8.n[3]) + local_120.n[3];
      local_220.n[4] = (0xffffffc - local_1e8.n[4]) + local_120.n[4];
      local_220.n[5] = (0xffffffc - local_1e8.n[5]) + local_120.n[5];
      local_220.n[6] = (0xffffffc - local_1e8.n[6]) + local_120.n[6];
      local_220.n[7] = (0xffffffc - local_1e8.n[7]) + local_120.n[7];
      local_220.n[8] = (0xffffffc - local_1e8.n[8]) + local_120.n[8];
      local_220.n[9] = (0xfffffc - local_1e8.n[9]) + local_120.n[9];
      iVar2 = secp256k1_fe_normalizes_to_zero_var(&local_148);
      if (iVar2 == 0) {
        secp256k1_fe_sqr(&local_170,&local_220);
        secp256k1_fe_sqr(&local_58,&local_148);
        secp256k1_fe_mul(&local_80,&local_148,&local_58);
        secp256k1_fe_mul(&local_148,&local_148,local_1f0);
        secp256k1_fe_mul(&r->z,local_1f8,&local_148);
        secp256k1_fe_mul(&local_a8,&local_d0,&local_58);
        *(ulong *)(r->x).n = CONCAT44(local_a8.n[1],local_a8.n[0]);
        *(ulong *)((r->x).n + 2) = CONCAT44(local_a8.n[3],local_a8.n[2]);
        *(ulong *)((r->x).n + 4) = CONCAT44(local_a8.n[5],local_a8.n[4]);
        *(ulong *)((r->x).n + 6) = CONCAT44(local_a8.n[7],local_a8.n[6]);
        *(ulong *)((r->x).n + 8) = CONCAT44(local_a8.n[9],local_a8.n[8]);
        uVar8 = (r->x).n[1];
        uVar5 = (r->x).n[0] * 2;
        (r->x).n[0] = uVar5;
        uVar8 = uVar8 * 2;
        (r->x).n[1] = uVar8;
        uVar6 = (r->x).n[2] * 2;
        (r->x).n[2] = uVar6;
        uVar9 = (r->x).n[3] * 2;
        (r->x).n[3] = uVar9;
        uVar11 = (r->x).n[5];
        uVar10 = (r->x).n[4] * 2;
        (r->x).n[4] = uVar10;
        uVar11 = uVar11 * 2;
        (r->x).n[5] = uVar11;
        uVar12 = (r->x).n[6] * 2;
        (r->x).n[6] = uVar12;
        uVar13 = (r->x).n[7] * 2;
        (r->x).n[7] = uVar13;
        uVar3 = (r->x).n[8] * 2;
        (r->x).n[8] = uVar3;
        uVar7 = (r->x).n[9] * 2;
        (r->x).n[9] = uVar7;
        uVar5 = uVar5 + local_80.n[0];
        (r->x).n[0] = uVar5;
        uVar8 = uVar8 + local_80.n[1];
        (r->x).n[1] = uVar8;
        uVar6 = uVar6 + local_80.n[2];
        (r->x).n[2] = uVar6;
        uVar9 = uVar9 + local_80.n[3];
        (r->x).n[3] = uVar9;
        uVar10 = uVar10 + local_80.n[4];
        (r->x).n[4] = uVar10;
        uVar11 = uVar11 + local_80.n[5];
        (r->x).n[5] = uVar11;
        uVar12 = uVar12 + local_80.n[6];
        (r->x).n[6] = uVar12;
        uVar13 = uVar13 + local_80.n[7];
        (r->x).n[7] = uVar13;
        uVar3 = uVar3 + local_80.n[8];
        (r->x).n[8] = uVar3;
        uVar5 = 0x1fffe178 - uVar5;
        uVar8 = 0x1ffffdf8 - uVar8;
        uVar6 = 0x1ffffff8 - uVar6;
        uVar9 = 0x1ffffff8 - uVar9;
        uVar10 = 0x1ffffff8 - uVar10;
        uVar11 = 0x1ffffff8 - uVar11;
        uVar12 = 0x1ffffff8 - uVar12;
        uVar13 = 0x1ffffff8 - uVar13;
        uVar3 = 0x1ffffff8 - uVar3;
        uVar7 = 0x1fffff8 - (uVar7 + local_80.n[9]);
        (r->x).n[0] = uVar5;
        (r->x).n[1] = uVar8;
        (r->x).n[2] = uVar6;
        (r->x).n[3] = uVar9;
        (r->x).n[4] = uVar10;
        (r->x).n[5] = uVar11;
        (r->x).n[6] = uVar12;
        (r->x).n[7] = uVar13;
        (r->x).n[8] = uVar3;
        (r->x).n[9] = uVar7;
        uVar5 = uVar5 + local_170.n[0];
        (r->x).n[0] = uVar5;
        uVar8 = uVar8 + local_170.n[1];
        (r->x).n[1] = uVar8;
        uVar6 = uVar6 + local_170.n[2];
        (r->x).n[2] = uVar6;
        uVar9 = uVar9 + local_170.n[3];
        (r->x).n[3] = uVar9;
        uVar10 = uVar10 + local_170.n[4];
        (r->x).n[4] = uVar10;
        uVar11 = uVar11 + local_170.n[5];
        (r->x).n[5] = uVar11;
        uVar12 = uVar12 + local_170.n[6];
        (r->x).n[6] = uVar12;
        uVar13 = uVar13 + local_170.n[7];
        (r->x).n[7] = uVar13;
        uVar3 = uVar3 + local_170.n[8];
        (r->x).n[8] = uVar3;
        uVar7 = uVar7 + local_170.n[9];
        (r->x).n[9] = uVar7;
        uVar5 = 0x2fffd234 - uVar5;
        uVar8 = 0x2ffffcf4 - uVar8;
        uVar6 = 0x2ffffff4 - uVar6;
        uVar9 = 0x2ffffff4 - uVar9;
        uVar10 = 0x2ffffff4 - uVar10;
        uVar11 = 0x2ffffff4 - uVar11;
        uVar12 = 0x2ffffff4 - uVar12;
        uVar13 = 0x2ffffff4 - uVar13;
        uVar3 = 0x2ffffff4 - uVar3;
        uVar7 = 0x2fffff4 - uVar7;
        (r->y).n[0] = uVar5;
        (r->y).n[1] = uVar8;
        (r->y).n[2] = uVar6;
        (r->y).n[3] = uVar9;
        (r->y).n[4] = uVar10;
        (r->y).n[5] = uVar11;
        (r->y).n[6] = uVar12;
        (r->y).n[7] = uVar13;
        (r->y).n[8] = uVar3;
        (r->y).n[9] = uVar7;
        (r->y).n[0] = uVar5 + local_a8.n[0];
        (r->y).n[1] = uVar8 + local_a8.n[1];
        (r->y).n[2] = uVar6 + local_a8.n[2];
        (r->y).n[3] = uVar9 + local_a8.n[3];
        (r->y).n[4] = uVar10 + local_a8.n[4];
        (r->y).n[5] = uVar11 + local_a8.n[5];
        (r->y).n[6] = uVar12 + local_a8.n[6];
        (r->y).n[7] = uVar13 + local_a8.n[7];
        (r->y).n[8] = uVar3 + local_a8.n[8];
        (r->y).n[9] = uVar7 + local_a8.n[9];
        secp256k1_fe_mul(&r->y,&r->y,&local_220);
        secp256k1_fe_mul(&local_80,&local_80,&local_1e8);
        (r->y).n[0] = (r->y).n[0] + (0xffff0bc - local_80.n[0]);
        puVar1 = (r->y).n + 1;
        *puVar1 = *puVar1 + (0xffffefc - local_80.n[1]);
        puVar1 = (r->y).n + 2;
        *puVar1 = *puVar1 + (0xffffffc - local_80.n[2]);
        puVar1 = (r->y).n + 3;
        *puVar1 = *puVar1 + (0xffffffc - local_80.n[3]);
        puVar1 = (r->y).n + 4;
        *puVar1 = *puVar1 + (0xffffffc - local_80.n[4]);
        puVar1 = (r->y).n + 5;
        *puVar1 = *puVar1 + (0xffffffc - local_80.n[5]);
        puVar1 = (r->y).n + 6;
        *puVar1 = *puVar1 + (0xffffffc - local_80.n[6]);
        puVar1 = (r->y).n + 7;
        *puVar1 = *puVar1 + (0xffffffc - local_80.n[7]);
        puVar1 = (r->y).n + 8;
        *puVar1 = *puVar1 + (0xffffffc - local_80.n[8]);
        puVar1 = (r->y).n + 9;
        *puVar1 = *puVar1 + (0xfffffc - local_80.n[9]);
        return;
      }
      iVar2 = secp256k1_fe_normalizes_to_zero_var(&local_220);
      if (iVar2 == 0) {
        r->infinity = 1;
        return;
      }
      secp256k1_gej_double_var(r,a,rzr_00);
      return;
    }
    lVar4 = 0x1f;
  }
  else {
    lVar4 = 0x1f;
    a = b;
  }
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    (r->x).n[0] = (a->x).n[0];
    a = (secp256k1_gej *)((a->x).n + 1);
    r = (secp256k1_gej *)((r->x).n + 1);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* Operations: 12 mul, 4 sqr, 2 normalize, 12 mul_int/add/negate */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }

    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    r->infinity = 0;
    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            r->infinity = 1;
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    secp256k1_fe_mul(&h, &h, &b->z);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}